

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O0

bool __thiscall
wallet::CCrypter::SetKeyFromPassphrase
          (CCrypter *this,SecureString *key_data,
          span<const_unsigned_char,_18446744073709551615UL> salt,uint rounds,uint derivation_method)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  size_type sVar2;
  SecureString *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  int i;
  uchar *in_stack_000000d0;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  int count;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar3;
  undefined1 local_29;
  
  count = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8D != 0) {
    sVar2 = std::span<const_unsigned_char,_18446744073709551615UL>::size(in_stack_ffffffffffffff68);
    if (sVar2 == 8) {
      iVar3 = 0;
      if (in_R9D == 0) {
        std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff68 =
             (span<const_unsigned_char,_18446744073709551615UL> *)
             std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                        in_stack_ffffffffffffff68);
        salt_00._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffffb0;
        salt_00._M_ptr = (pointer)in_RDI;
        salt_00._M_extent._M_extent_value._4_4_ = iVar3;
        iVar3 = BytesToKeySHA512AES((CCrypter *)CONCAT44(in_R8D,in_stack_ffffffffffffff98),salt_00,
                                    in_RSI,count,in_stack_ffffffffffffff80,in_stack_000000d0);
      }
      if (iVar3 == 0x20) {
        *(undefined1 *)(in_RDI + 0x30) = 1;
        local_29 = true;
      }
      else {
        std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff68);
        std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff68);
        memory_cleanse(in_stack_ffffffffffffff68,0xbc1c0e);
        std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff68);
        std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff68);
        memory_cleanse(in_stack_ffffffffffffff68,0xbc1c3c);
        local_29 = false;
      }
      goto LAB_00bc1c51;
    }
  }
  local_29 = false;
LAB_00bc1c51:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool CCrypter::SetKeyFromPassphrase(const SecureString& key_data, const std::span<const unsigned char> salt, const unsigned int rounds, const unsigned int derivation_method)
{
    if (rounds < 1 || salt.size() != WALLET_CRYPTO_SALT_SIZE) {
        return false;
    }

    int i = 0;
    if (derivation_method == 0) {
        i = BytesToKeySHA512AES(salt, key_data, rounds, vchKey.data(), vchIV.data());
    }

    if (i != (int)WALLET_CRYPTO_KEY_SIZE)
    {
        memory_cleanse(vchKey.data(), vchKey.size());
        memory_cleanse(vchIV.data(), vchIV.size());
        return false;
    }

    fKeySet = true;
    return true;
}